

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapOrSetDataList.h
# Opt level: O2

bool __thiscall Js::MapOrSetDataList<void_*>::Iterator::Next(Iterator *this)

{
  Type *this_00;
  MapOrSetDataList<void_*> *pMVar1;
  MapOrSetDataNode<void_*> *pMVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  MapOrSetDataNode<void_*> *other;
  
  pMVar1 = (this->list).ptr;
  if ((pMVar1 == (MapOrSetDataList<void_*> *)0x0) ||
     ((pMVar1->first).ptr == (MapOrSetDataNode<void_*> *)0x0)) goto LAB_007f2c81;
  this_00 = &this->current;
  other = (this->current).ptr;
  if (other == (MapOrSetDataNode<void_*> *)0x0) {
LAB_007f2c6c:
    other = (MapOrSetDataNode<void_*> *)0x0;
  }
  else {
    while (pMVar2 = (other->prev).ptr, pMVar2 != (MapOrSetDataNode<void_*> *)0x0) {
      if ((pMVar2->next).ptr == other) goto LAB_007f2c01;
      Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(this_00,&other->prev);
      other = this_00->ptr;
    }
    pMVar1 = (this->list).ptr;
    if (other != (pMVar1->first).ptr) {
      Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(this_00,&pMVar1->first);
      if (this_00->ptr != (MapOrSetDataNode<void_*> *)0x0) {
        return true;
      }
      goto LAB_007f2c81;
    }
LAB_007f2c01:
    if (((other->next).ptr == (MapOrSetDataNode<void_*> *)0x0) &&
       (pMVar2 = (((this->list).ptr)->last).ptr, other != pMVar2)) {
      if (pMVar2 != (MapOrSetDataNode<void_*> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                    ,100,"(list->last == nullptr)","list->last == nullptr");
        if (!bVar4) goto LAB_007f2cf8;
        *puVar5 = 0;
      }
      this_00->ptr = (MapOrSetDataNode<void_*> *)0x0;
      goto LAB_007f2c6c;
    }
  }
  pMVar2 = (MapOrSetDataNode<void_*> *)(this->list).ptr;
  if (other != (pMVar2->prev).ptr) {
    if ((other == (MapOrSetDataNode<void_*> *)0x0) &&
       (other = pMVar2, (pMVar2->next).ptr == (MapOrSetDataNode<void_*> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/MapOrSetDataList.h"
                                  ,0x6d,"(list->first != nullptr)","list->first != nullptr");
      if (!bVar4) {
LAB_007f2cf8:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
      other = (MapOrSetDataNode<void_*> *)(this->list).ptr;
    }
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::operator=(this_00,&other->next);
    return true;
  }
LAB_007f2c81:
  (this->list).ptr = (MapOrSetDataList<void_*> *)0x0;
  (this->current).ptr = (MapOrSetDataNode<void_*> *)0x0;
  return false;
}

Assistant:

bool Next()
            {
                // Nodes can be deleted while iterating so validate current
                // and if it is not valid find last valid node by following
                // previous toward first.
                // Note: clear will simply null out first and last, but
                // not invalidated nodes, so we must also check to see that
                // first is not null

                if (list == nullptr || list->first == nullptr)
                {
                    // list is empty or was cleared during enumeration
                    list = nullptr;
                    current = nullptr;
                    return false;
                }

                if (current)
                {
                    while (current->prev && current->prev->next != current)
                    {
                        current = current->prev;
                    }

                    if (current->prev == nullptr && current != list->first)
                    {
                        current = list->first;

                        if (current != nullptr)
                        {
                            return true;
                        }

                        list = nullptr;
                        current = nullptr;
                        return false;
                    }

                    if (current->next == nullptr && current != list->last)
                    {
                        Assert(list->last == nullptr);
                        current = nullptr;
                    }
                }

                if (current != list->last)
                {
                    if (current == nullptr)
                    {
                        Assert(list->first != nullptr);
                        current = list->first;
                    }
                    else
                    {
                        current = current->next;
                    }
                    return true;
                }

                list = nullptr;
                current = nullptr;
                return false;
            }